

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_index.cpp
# Opt level: O2

void __thiscall BamTools::IndexTool::~IndexTool(IndexTool *this)

{
  IndexSettings *pIVar1;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__IndexTool_001f20d0;
  pIVar1 = this->m_settings;
  if (pIVar1 != (IndexSettings *)0x0) {
    std::__cxx11::string::~string((string *)&pIVar1->InputBamFilename);
  }
  operator_delete(pIVar1);
  this->m_settings = (IndexSettings *)0x0;
  operator_delete(this->m_impl);
  this->m_impl = (IndexToolPrivate *)0x0;
  return;
}

Assistant:

IndexTool::~IndexTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}